

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O3

char_t * pugi::impl::anon_unknown_0::strconv_escape(char_t *s,gap *g)

{
  byte bVar1;
  char cVar2;
  uint uVar3;
  size_t count;
  uint ch;
  char_t *pcVar4;
  value_type local_18;
  
  local_18 = (value_type)(s + 1);
  bVar1 = s[1];
  if (bVar1 < 0x67) {
    if (bVar1 == 0x23) {
      pcVar4 = s + 2;
      cVar2 = s[2];
      if (cVar2 == ';') {
        return pcVar4;
      }
      if (cVar2 == 'x') {
        pcVar4 = s + 3;
        cVar2 = s[3];
        if (cVar2 == ';') {
          return pcVar4;
        }
        ch = 0;
        do {
          uVar3 = (int)cVar2 - 0x30;
          if (uVar3 < 10) {
            ch = ch << 4 | uVar3;
          }
          else {
            uVar3 = (int)cVar2 | 0x20;
            if (5 < uVar3 - 0x61) goto joined_r0x0018c0b7;
            ch = (ch * 0x10 + uVar3) - 0x57;
          }
          cVar2 = pcVar4[1];
          pcVar4 = pcVar4 + 1;
        } while( true );
      }
      uVar3 = (int)cVar2 - 0x30;
      if (9 < uVar3) {
        return pcVar4;
      }
      ch = 0;
      do {
        ch = uVar3 + ch * 10;
        cVar2 = pcVar4[1];
        pcVar4 = pcVar4 + 1;
        uVar3 = (int)cVar2 - 0x30;
      } while (uVar3 < 10);
joined_r0x0018c0b7:
      if (cVar2 != ';') {
        return pcVar4;
      }
      pcVar4 = pcVar4 + 1;
      if (ch < 0x10000) {
        local_18 = utf8_writer::low((value_type)s,ch);
      }
      else {
        *s = (byte)(ch >> 0x12) | 0xf0;
        s[1] = (byte)(ch >> 0xc) & 0x3f | 0x80;
        s[2] = (byte)(ch >> 6) & 0x3f | 0x80;
        s[3] = (byte)ch & 0x3f | 0x80;
        local_18 = (value_type)(s + 4);
      }
      count = (long)pcVar4 - (long)local_18;
      goto LAB_0018bfec;
    }
    if (bVar1 != 0x61) {
      return (char_t *)local_18;
    }
    if (s[2] != 'p') {
      if (s[2] != 'm') goto LAB_0018bffc;
      if (s[3] != 'p') goto LAB_0018c080;
      if (s[4] != ';') goto LAB_0018c0af;
      *s = '&';
      pcVar4 = s + 5;
      count = 4;
      goto LAB_0018bfec;
    }
    if (s[3] != 'o') {
LAB_0018c080:
      return s + 3;
    }
    if (s[4] != 's') {
LAB_0018c0af:
      return s + 4;
    }
    if (s[5] != ';') {
LAB_0018c0ce:
      return s + 5;
    }
    *s = '\'';
LAB_0018c072:
    pcVar4 = s + 6;
    count = 5;
  }
  else {
    if (bVar1 == 0x67) {
      if (s[2] != 't') goto LAB_0018bffc;
      if (s[3] != ';') goto LAB_0018c080;
      *s = '>';
    }
    else {
      if (bVar1 != 0x6c) {
        if (bVar1 != 0x71) {
          return (char_t *)local_18;
        }
        if (s[2] != 'u') {
LAB_0018bffc:
          return s + 2;
        }
        if (s[3] != 'o') goto LAB_0018c080;
        if (s[4] != 't') goto LAB_0018c0af;
        if (s[5] != ';') goto LAB_0018c0ce;
        *s = '\"';
        goto LAB_0018c072;
      }
      if (s[2] != 't') goto LAB_0018bffc;
      if (s[3] != ';') goto LAB_0018c080;
      *s = '<';
    }
    pcVar4 = s + 4;
    count = 3;
  }
LAB_0018bfec:
  gap::push(g,(char_t **)&local_18,count);
  return pcVar4;
}

Assistant:

PUGI__FN char_t* strconv_escape(char_t* s, gap& g)
	{
		char_t* stre = s + 1;

		switch (*stre)
		{
			case '#':	// &#...
			{
				unsigned int ucsc = 0;

				if (stre[1] == 'x') // &#x... (hex code)
				{
					stre += 2;

					char_t ch = *stre;

					if (ch == ';') return stre;

					for (;;)
					{
						if (static_cast<unsigned int>(ch - '0') <= 9)
							ucsc = 16 * ucsc + (ch - '0');
						else if (static_cast<unsigned int>((ch | ' ') - 'a') <= 5)
							ucsc = 16 * ucsc + ((ch | ' ') - 'a' + 10);
						else if (ch == ';')
							break;
						else // cancel
							return stre;

						ch = *++stre;
					}

					++stre;
				}
				else	// &#... (dec code)
				{
					char_t ch = *++stre;

					if (ch == ';') return stre;

					for (;;)
					{
						if (static_cast<unsigned int>(ch - '0') <= 9)
							ucsc = 10 * ucsc + (ch - '0');
						else if (ch == ';')
							break;
						else // cancel
							return stre;

						ch = *++stre;
					}

					++stre;
				}

			#ifdef PUGIXML_WCHAR_MODE
				s = reinterpret_cast<char_t*>(wchar_writer::any(reinterpret_cast<wchar_writer::value_type>(s), ucsc));
			#else
				s = reinterpret_cast<char_t*>(utf8_writer::any(reinterpret_cast<uint8_t*>(s), ucsc));
			#endif

				g.push(s, stre - s);
				return stre;
			}

			case 'a':	// &a
			{
				++stre;

				if (*stre == 'm') // &am
				{
					if (*++stre == 'p' && *++stre == ';') // &amp;
					{
						*s++ = '&';
						++stre;

						g.push(s, stre - s);
						return stre;
					}
				}
				else if (*stre == 'p') // &ap
				{
					if (*++stre == 'o' && *++stre == 's' && *++stre == ';') // &apos;
					{
						*s++ = '\'';
						++stre;

						g.push(s, stre - s);
						return stre;
					}
				}
				break;
			}

			case 'g': // &g
			{
				if (*++stre == 't' && *++stre == ';') // &gt;
				{
					*s++ = '>';
					++stre;

					g.push(s, stre - s);
					return stre;
				}
				break;
			}

			case 'l': // &l
			{
				if (*++stre == 't' && *++stre == ';') // &lt;
				{
					*s++ = '<';
					++stre;

					g.push(s, stre - s);
					return stre;
				}
				break;
			}

			case 'q': // &q
			{
				if (*++stre == 'u' && *++stre == 'o' && *++stre == 't' && *++stre == ';') // &quot;
				{
					*s++ = '"';
					++stre;

					g.push(s, stre - s);
					return stre;
				}
				break;
			}

			default:
				break;
		}

		return stre;
	}